

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O1

string * __thiscall
util::encoding_name_abi_cxx11_(string *__return_storage_ptr__,util *this,codepage_id codepage)

{
  char *__s;
  size_t sVar1;
  ostringstream oss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  __s = anon_unknown_0::get_encoding_name((codepage_id)this);
  if (__s == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Windows-",8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_190);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,__s,__s + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string encoding_name(codepage_id codepage) {
	
	const char * name = get_encoding_name(codepage);
	if(name) {
		return name;
	}
	
	std::ostringstream oss;
	oss << "Windows-" << codepage;
	
	return oss.str();
}